

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O0

void __thiscall
FRemapTable::AddColorRange
          (FRemapTable *this,int start,int end,int _r1,int _g1,int _b1,int _r2,int _g2,int _b2)

{
  BYTE BVar1;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_9c;
  uint local_98;
  int local_94;
  int j;
  int i;
  double local_88;
  double bs;
  double gs;
  double rs;
  double b;
  double g;
  double r;
  double b2;
  double g2;
  double r2;
  double b1;
  double g1;
  double r1;
  int local_20;
  int _b1_local;
  int _g1_local;
  int _r1_local;
  int end_local;
  int start_local;
  FRemapTable *this_local;
  
  g = (double)_r1;
  b = (double)_g1;
  rs = (double)_b1;
  g2 = (double)_r2;
  b2 = (double)_g2;
  r = (double)_b2;
  r2 = rs;
  b1 = b;
  g1 = g;
  r1._4_4_ = _b1;
  local_20 = _g1;
  _b1_local = _r1;
  _g1_local = end;
  _r1_local = start;
  _end_local = this;
  if (end < start) {
    swapvalues<int>(&_r1_local,&_g1_local);
    g = g2;
    b = b2;
    rs = r;
    gs = g1 - g2;
    bs = b1 - b2;
    local_88 = r2 - r;
  }
  else {
    gs = g2 - g;
    bs = b2 - b;
    local_88 = r - rs;
  }
  if (_r1_local == _g1_local) {
    _r1_local = (int)GPalette.Remap[_r1_local];
    BVar1 = 0xff;
    if (_r1_local == 0) {
      BVar1 = '\0';
    }
    PalEntry::PalEntry((PalEntry *)&i,BVar1,(BYTE)(int)g,(BYTE)(int)b,(BYTE)(int)rs);
    this->Palette[_r1_local].field_0.d = i;
    j = *(int *)&this->Palette[_r1_local].field_0.field_0;
    BVar1 = FColorMatcher::Pick(&ColorMatcher,(PalEntry)j);
    this->Remap[_r1_local] = BVar1;
  }
  else {
    gs = gs / (double)(_g1_local - _r1_local);
    bs = bs / (double)(_g1_local - _r1_local);
    local_88 = local_88 / (double)(_g1_local - _r1_local);
    for (local_94 = _r1_local; local_94 <= _g1_local; local_94 = local_94 + 1) {
      local_98 = (uint)GPalette.Remap[local_94];
      BVar1 = 0xff;
      if (local_98 == 0) {
        BVar1 = '\0';
      }
      PalEntry::PalEntry((PalEntry *)&local_9c.field_0,BVar1,(BYTE)(int)g,(BYTE)(int)b,(BYTE)(int)rs
                        );
      this->Palette[(int)local_98].field_0 = local_9c;
      BVar1 = FColorMatcher::Pick(&ColorMatcher,
                                  (PalEntry)this->Palette[(int)local_98].field_0.field_0);
      this->Remap[(int)local_98] = BVar1;
      g = gs + g;
      b = bs + b;
      rs = local_88 + rs;
    }
  }
  return;
}

Assistant:

void FRemapTable::AddColorRange(int start, int end, int _r1,int _g1, int _b1, int _r2, int _g2, int _b2)
{
	double r1 = _r1;
	double g1 = _g1;
	double b1 = _b1;
	double r2 = _r2;
	double g2 = _g2;
	double b2 = _b2;
	double r, g, b;
	double rs, gs, bs;

	if (start > end)
	{
		swapvalues (start, end);
		r = r2;
		g = g2;
		b = b2;
		rs = r1 - r2;
		gs = g1 - g2;
		bs = b1 - b2;
	}
	else
	{
		r = r1;
		g = g1;
		b = b1;
		rs = r2 - r1;
		gs = g2 - g1;
		bs = b2 - b1;
	}
	if (start == end)
	{
		start = GPalette.Remap[start];
		Palette[start] = PalEntry(start == 0 ? 0 : 255, int(r), int(g), int(b));
		Remap[start] = ColorMatcher.Pick(Palette[start]);
	}
	else
	{
		rs /= (end - start);
		gs /= (end - start);
		bs /= (end - start);
		for (int i = start; i <= end; ++i)
		{
			int j = GPalette.Remap[i];
			Palette[j] = PalEntry(j == 0 ? 0 : 255, int(r), int(g), int(b));
			Remap[j] = ColorMatcher.Pick(Palette[j]);
			r += rs;
			g += gs;
			b += bs;
		}
	}
}